

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O1

bool GetIntersection(ImVec2 p0,ImVec2 p1,ImVec2 p2,ImVec2 p3,ImVec2 *i)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  undefined4 uVar2;
  float fVar3;
  float fVar5;
  ImVec2 IVar4;
  undefined8 in_XMM0_Qb;
  float fVar6;
  float fVar7;
  undefined8 in_XMM2_Qb;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar3 = p0.x;
  fVar6 = p1.x - fVar3;
  fVar5 = p0.y;
  fVar7 = p1.y - fVar5;
  fVar8 = p3.x - p2.x;
  fVar9 = p3.y - p2.y;
  fVar16 = fVar6 * fVar9 - fVar8 * fVar7;
  fVar12 = fVar3 - p2.x;
  fVar13 = fVar5 - p2.y;
  fVar14 = (float)in_XMM0_Qb - (float)in_XMM2_Qb;
  fVar15 = (float)((ulong)in_XMM0_Qb >> 0x20) - (float)((ulong)in_XMM2_Qb >> 0x20);
  auVar10._0_4_ = -fVar7 * fVar12 + fVar13 * fVar6;
  auVar10._4_4_ = fVar8 * fVar13 + fVar12 * -fVar9;
  auVar10._8_4_ = -fVar7 * fVar14 + fVar14 * fVar6;
  auVar10._12_4_ = fVar9 * fVar15 + fVar15 * fVar6;
  auVar11._4_4_ = fVar16;
  auVar11._0_4_ = fVar16;
  auVar11._8_4_ = fVar16;
  auVar11._12_4_ = fVar16;
  auVar11 = divps(auVar10,auVar11);
  fVar8 = auVar11._4_4_;
  auVar1._4_4_ = -(uint)(fVar8 <= 1.0);
  auVar1._0_4_ = -(uint)(auVar11._0_4_ <= 1.0);
  auVar1._8_4_ = -(uint)(0.0 <= auVar11._0_4_);
  auVar1._12_4_ = -(uint)(0.0 <= fVar8);
  uVar2 = movmskps(in_EAX,auVar1);
  if ((i != (ImVec2 *)0x0) && ((char)uVar2 == '\x0f')) {
    IVar4.y = fVar8 * fVar7 + fVar5;
    IVar4.x = fVar8 * fVar6 + fVar3;
    *i = IVar4;
  }
  return (char)uVar2 == '\x0f';
}

Assistant:

bool GetIntersection(ImVec2 p0, ImVec2 p1, ImVec2 p2, ImVec2 p3, ImVec2 *i) {

	ImVec2 s1, s2;
	s1.x = p1.x - p0.x;
	s1.y = p1.y - p0.y;
	s2.x = p3.x - p2.x;
	s2.y = p3.y - p2.y;

	double s = (-s1.y * (p0.x - p2.x) + s1.x * (p0.y - p2.y)) / (-s2.x * s1.y + s1.x * s2.y);
	double t = (s2.x * (p0.y - p2.y) - s2.y * (p0.x - p2.x)) / (-s2.x * s1.y + s1.x * s2.y);

	if (s >= 0 && s <= 1 && t >= 0 && t <= 1) {
		// Collision detected
		//
		if (i) {
			i->x = p0.x + (t * s1.x);
			i->y = p0.y + (t * s1.y);
		}
		return true;
	}

	return false; // No collision
}